

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

HighsHashTableEntry<int,_int> *
HighsHashTree<int,_int>::find_common_recurse(NodePtr n1,NodePtr n2,int hashPos)

{
  NodePtr n2_00;
  Type TVar1;
  Type TVar2;
  int iVar3;
  ValueType *pVVar4;
  BranchNode *this;
  BranchNode *this_00;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong n;
  logic_error *this_01;
  undefined4 in_EDX;
  NodePtr in_RSI;
  HighsHashTableEntry<int,_int> *match;
  int location2;
  int location1;
  int pos;
  uint64_t matchMask;
  BranchNode *branch2;
  BranchNode *branch1;
  ListNode *iter;
  ListLeaf *leaf;
  uint8_t in_stack_ffffffffffffff2f;
  Occupation *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  InnerLeaf<4> *in_stack_ffffffffffffffa0;
  NodePtr in_stack_ffffffffffffffa8;
  ListLeaf *local_30;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  NodePtr local_10;
  HighsHashTableEntry<int,_int> *local_8;
  
  TVar1 = NodePtr::getType(&local_10);
  TVar2 = NodePtr::getType((NodePtr *)&stack0xffffffffffffffe8);
  if ((int)TVar2 < (int)TVar1) {
    std::swap<HighsHashTree<int,int>::NodePtr>(&local_10,(NodePtr *)&stack0xffffffffffffffe8);
  }
  TVar1 = NodePtr::getType(&local_10);
  iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  switch(TVar1) {
  case kEmpty:
    local_8 = (HighsHashTableEntry<int,_int> *)0x0;
    break;
  case kListLeaf:
    local_30 = NodePtr::getListLeaf(&local_10);
    do {
      HighsHashTableEntry<int,_int>::key(&(local_30->first).entry);
      compute_hash((int *)0x5751cc);
      HighsHashTableEntry<int,_int>::key(&(local_30->first).entry);
      pVVar4 = find_recurse(in_stack_ffffffffffffffa8,(uint64_t)in_stack_ffffffffffffffa0,
                            (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                            in_stack_ffffffffffffff90);
      if (pVVar4 != (ValueType *)0x0) {
        return &(local_30->first).entry;
      }
      local_30 = (ListLeaf *)(local_30->first).next;
    } while (local_30 != (ListLeaf *)0x0);
    local_8 = (HighsHashTableEntry<int,_int> *)0x0;
    break;
  case kInnerLeafSizeClass1:
    NodePtr::getInnerLeafSizeClass1(&local_10);
    local_8 = findCommonInLeaf<1>((InnerLeaf<1> *)in_stack_ffffffffffffffa0,
                                  in_stack_ffffffffffffffa8,iVar3);
    break;
  case kInnerLeafSizeClass2:
    NodePtr::getInnerLeafSizeClass2(&local_10);
    local_8 = findCommonInLeaf<2>((InnerLeaf<2> *)in_stack_ffffffffffffffa0,
                                  in_stack_ffffffffffffffa8,iVar3);
    break;
  case kInnerLeafSizeClass3:
    NodePtr::getInnerLeafSizeClass3(&local_10);
    local_8 = findCommonInLeaf<3>((InnerLeaf<3> *)in_stack_ffffffffffffffa0,
                                  in_stack_ffffffffffffffa8,iVar3);
    break;
  case kInnerLeafSizeClass4:
    NodePtr::getInnerLeafSizeClass4(&local_10);
    local_8 = findCommonInLeaf<4>(in_stack_ffffffffffffffa0,in_RSI,iVar3);
    break;
  case kBranchNode:
    this = NodePtr::getBranchNode(&local_10);
    this_00 = NodePtr::getBranchNode((NodePtr *)&stack0xffffffffffffffe8);
    uVar5 = ::HighsHashTree::Occupation::operator_cast_to_unsigned_long((Occupation *)this);
    uVar6 = ::HighsHashTree::Occupation::operator_cast_to_unsigned_long((Occupation *)this_00);
    n = uVar5 & uVar6;
    do {
      if (n == 0) {
        return (HighsHashTableEntry<int,_int> *)0x0;
      }
      iVar3 = HighsHashHelpers::log2i(n);
      n = 1L << ((byte)iVar3 & 0x3f) ^ n;
      Occupation::num_set_until(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
      Occupation::num_set_until(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2f);
      n2_00.ptrAndType._4_4_ = in_EDX;
      n2_00.ptrAndType._0_4_ = in_stack_ffffffffffffffe0;
      local_8 = find_common_recurse(in_RSI,n2_00,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    } while (local_8 == (HighsHashTableEntry<int,_int> *)0x0);
    break;
  default:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"Unexpected type in hash tree");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return local_8;
}

Assistant:

static const HighsHashTableEntry<K, V>* find_common_recurse(NodePtr n1,
                                                              NodePtr n2,
                                                              int hashPos) {
    if (n1.getType() > n2.getType()) std::swap(n1, n2);

    switch (n1.getType()) {
      case kEmpty:
        return nullptr;
      case kListLeaf: {
        ListLeaf* leaf = n1.getListLeaf();
        ListNode* iter = &leaf->first;
        do {
          if (find_recurse(n2, compute_hash(iter->entry.key()), hashPos,
                           iter->entry.key()))
            return &iter->entry;
          iter = iter->next;
        } while (iter != nullptr);
        return nullptr;
      }
      case kInnerLeafSizeClass1:
        return findCommonInLeaf(n1.getInnerLeafSizeClass1(), n2, hashPos);
      case kInnerLeafSizeClass2:
        return findCommonInLeaf(n1.getInnerLeafSizeClass2(), n2, hashPos);
      case kInnerLeafSizeClass3:
        return findCommonInLeaf(n1.getInnerLeafSizeClass3(), n2, hashPos);
      case kInnerLeafSizeClass4:
        return findCommonInLeaf(n1.getInnerLeafSizeClass4(), n2, hashPos);
      case kBranchNode: {
        BranchNode* branch1 = n1.getBranchNode();
        BranchNode* branch2 = n2.getBranchNode();

        uint64_t matchMask = branch1->occupation & branch2->occupation;

        while (matchMask) {
          int pos = HighsHashHelpers::log2i(matchMask);
          assert((branch1->occupation >> pos) & 1);
          assert((branch2->occupation >> pos) & 1);
          assert((matchMask >> pos) & 1);

          matchMask ^= (uint64_t{1} << pos);

          assert(((matchMask >> pos) & 1) == 0);

          int location1 =
              branch1->occupation.num_set_until(static_cast<uint8_t>(pos)) - 1;
          int location2 =
              branch2->occupation.num_set_until(static_cast<uint8_t>(pos)) - 1;

          const HighsHashTableEntry<K, V>* match =
              find_common_recurse(branch1->child[location1],
                                  branch2->child[location2], hashPos + 1);
          if (match != nullptr) return match;
        }

        return nullptr;
      }
      default:
        throw std::logic_error("Unexpected type in hash tree");
    }
  }